

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LayerParameter::MergeFrom(LayerParameter *this,LayerParameter *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  TransformationParameter *this_00;
  TransformationParameter *from_00;
  LossParameter *this_01;
  LossParameter *from_01;
  AccuracyParameter *this_02;
  AccuracyParameter *from_02;
  ArgMaxParameter *this_03;
  ArgMaxParameter *from_03;
  ConcatParameter *this_04;
  ConcatParameter *from_04;
  ContrastiveLossParameter *this_05;
  ContrastiveLossParameter *from_05;
  ConvolutionParameter *this_06;
  ConvolutionParameter *from_06;
  DataParameter *this_07;
  DataParameter *from_07;
  DropoutParameter *this_08;
  DropoutParameter *from_08;
  DummyDataParameter *this_09;
  DummyDataParameter *from_09;
  EltwiseParameter *this_10;
  EltwiseParameter *from_10;
  ExpParameter *this_11;
  ExpParameter *from_11;
  HDF5DataParameter *this_12;
  HDF5DataParameter *from_12;
  HDF5OutputParameter *this_13;
  HDF5OutputParameter *from_13;
  HingeLossParameter *this_14;
  HingeLossParameter *from_14;
  ImageDataParameter *this_15;
  ImageDataParameter *from_15;
  InfogainLossParameter *this_16;
  InfogainLossParameter *from_16;
  InnerProductParameter *this_17;
  InnerProductParameter *from_17;
  LRNParameter *this_18;
  LRNParameter *from_18;
  MemoryDataParameter *this_19;
  MemoryDataParameter *from_19;
  MVNParameter *this_20;
  MVNParameter *from_20;
  PoolingParameter *this_21;
  PoolingParameter *from_21;
  PowerParameter *this_22;
  PowerParameter *from_22;
  ReLUParameter *this_23;
  ReLUParameter *from_23;
  SigmoidParameter *this_24;
  SigmoidParameter *from_24;
  SoftmaxParameter *this_25;
  SoftmaxParameter *from_25;
  SliceParameter *this_26;
  SliceParameter *from_26;
  TanHParameter *this_27;
  TanHParameter *from_27;
  ThresholdParameter *this_28;
  ThresholdParameter *from_28;
  WindowDataParameter *this_29;
  WindowDataParameter *from_29;
  PythonParameter *this_30;
  PythonParameter *from_30;
  PReLUParameter *this_31;
  PReLUParameter *from_31;
  SPPParameter *this_32;
  SPPParameter *from_32;
  ReshapeParameter *this_33;
  ReshapeParameter *from_33;
  LogParameter *this_34;
  LogParameter *from_34;
  FlattenParameter *this_35;
  FlattenParameter *from_35;
  ReductionParameter *this_36;
  ReductionParameter *from_36;
  EmbedParameter *this_37;
  EmbedParameter *from_37;
  TileParameter *this_38;
  TileParameter *from_38;
  BatchNormParameter *this_39;
  BatchNormParameter *from_39;
  ELUParameter *this_40;
  ELUParameter *from_40;
  BiasParameter *this_41;
  BiasParameter *from_41;
  ScaleParameter *this_42;
  ScaleParameter *from_42;
  InputParameter *this_43;
  InputParameter *from_43;
  CropParameter *this_44;
  CropParameter *from_44;
  ParameterParameter *this_45;
  ParameterParameter *from_45;
  RecurrentParameter *this_46;
  RecurrentParameter *from_46;
  InternalMetadataWithArena *this_47;
  LogFinisher local_d5;
  uint32 cached_has_bits;
  byte local_c1;
  LogMessage local_c0;
  LayerParameter *local_88;
  LayerParameter *from_local;
  LayerParameter *this_local;
  InternalMetadataWithArena *local_70;
  InternalMetadataWithArena *local_68;
  undefined4 local_4c;
  HasBits<2UL> *local_48;
  undefined4 local_3c;
  HasBits<2UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_c1 = 0;
  local_88 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x3ad1);
    local_c1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_c0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_d5,other);
  }
  if ((local_c1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  this_47 = &this->_internal_metadata_;
  this_local = (LayerParameter *)&local_88->_internal_metadata_;
  local_70 = this_47;
  local_68 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_47,&local_28->unknown_fields);
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->bottom_,&local_88->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->top_,&local_88->top_);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->loss_weight_,&local_88->loss_weight_);
  google::protobuf::RepeatedPtrField<caffe::ParamSpec>::MergeFrom(&this->param_,&local_88->param_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::MergeFrom(&this->blobs_,&local_88->blobs_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::MergeFrom
            (&this->include_,&local_88->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::MergeFrom
            (&this->exclude_,&local_88->exclude_);
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&this->propagate_down_,&local_88->propagate_down_);
  local_38 = &local_88->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->name_,psVar2,(local_88->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_type(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->type_,psVar2,(local_88->type_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      this_00 = mutable_transform_param(this);
      from_00 = transform_param(local_88);
      TransformationParameter::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 8) != 0) {
      this_01 = mutable_loss_param(this);
      from_01 = loss_param(local_88);
      LossParameter::MergeFrom(this_01,from_01);
    }
    if ((uVar1 & 0x10) != 0) {
      this_02 = mutable_accuracy_param(this);
      from_02 = accuracy_param(local_88);
      AccuracyParameter::MergeFrom(this_02,from_02);
    }
    if ((uVar1 & 0x20) != 0) {
      this_03 = mutable_argmax_param(this);
      from_03 = argmax_param(local_88);
      ArgMaxParameter::MergeFrom(this_03,from_03);
    }
    if ((uVar1 & 0x40) != 0) {
      this_04 = mutable_concat_param(this);
      from_04 = concat_param(local_88);
      ConcatParameter::MergeFrom(this_04,from_04);
    }
    if ((uVar1 & 0x80) != 0) {
      this_05 = mutable_contrastive_loss_param(this);
      from_05 = contrastive_loss_param(local_88);
      ContrastiveLossParameter::MergeFrom(this_05,from_05);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this_06 = mutable_convolution_param(this);
      from_06 = convolution_param(local_88);
      ConvolutionParameter::MergeFrom(this_06,from_06);
    }
    if ((uVar1 & 0x200) != 0) {
      this_07 = mutable_data_param(this);
      from_07 = data_param(local_88);
      DataParameter::MergeFrom(this_07,from_07);
    }
    if ((uVar1 & 0x400) != 0) {
      this_08 = mutable_dropout_param(this);
      from_08 = dropout_param(local_88);
      DropoutParameter::MergeFrom(this_08,from_08);
    }
    if ((uVar1 & 0x800) != 0) {
      this_09 = mutable_dummy_data_param(this);
      from_09 = dummy_data_param(local_88);
      DummyDataParameter::MergeFrom(this_09,from_09);
    }
    if ((uVar1 & 0x1000) != 0) {
      this_10 = mutable_eltwise_param(this);
      from_10 = eltwise_param(local_88);
      EltwiseParameter::MergeFrom(this_10,from_10);
    }
    if ((uVar1 & 0x2000) != 0) {
      this_11 = mutable_exp_param(this);
      from_11 = exp_param(local_88);
      ExpParameter::MergeFrom(this_11,from_11);
    }
    if ((uVar1 & 0x4000) != 0) {
      this_12 = mutable_hdf5_data_param(this);
      from_12 = hdf5_data_param(local_88);
      HDF5DataParameter::MergeFrom(this_12,from_12);
    }
    if ((uVar1 & 0x8000) != 0) {
      this_13 = mutable_hdf5_output_param(this);
      from_13 = hdf5_output_param(local_88);
      HDF5OutputParameter::MergeFrom(this_13,from_13);
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      this_14 = mutable_hinge_loss_param(this);
      from_14 = hinge_loss_param(local_88);
      HingeLossParameter::MergeFrom(this_14,from_14);
    }
    if ((uVar1 & 0x20000) != 0) {
      this_15 = mutable_image_data_param(this);
      from_15 = image_data_param(local_88);
      ImageDataParameter::MergeFrom(this_15,from_15);
    }
    if ((uVar1 & 0x40000) != 0) {
      this_16 = mutable_infogain_loss_param(this);
      from_16 = infogain_loss_param(local_88);
      InfogainLossParameter::MergeFrom(this_16,from_16);
    }
    if ((uVar1 & 0x80000) != 0) {
      this_17 = mutable_inner_product_param(this);
      from_17 = inner_product_param(local_88);
      InnerProductParameter::MergeFrom(this_17,from_17);
    }
    if ((uVar1 & 0x100000) != 0) {
      this_18 = mutable_lrn_param(this);
      from_18 = lrn_param(local_88);
      LRNParameter::MergeFrom(this_18,from_18);
    }
    if ((uVar1 & 0x200000) != 0) {
      this_19 = mutable_memory_data_param(this);
      from_19 = memory_data_param(local_88);
      MemoryDataParameter::MergeFrom(this_19,from_19);
    }
    if ((uVar1 & 0x400000) != 0) {
      this_20 = mutable_mvn_param(this);
      from_20 = mvn_param(local_88);
      MVNParameter::MergeFrom(this_20,from_20);
    }
    if ((uVar1 & 0x800000) != 0) {
      this_21 = mutable_pooling_param(this);
      from_21 = pooling_param(local_88);
      PoolingParameter::MergeFrom(this_21,from_21);
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      this_22 = mutable_power_param(this);
      from_22 = power_param(local_88);
      PowerParameter::MergeFrom(this_22,from_22);
    }
    if ((uVar1 & 0x2000000) != 0) {
      this_23 = mutable_relu_param(this);
      from_23 = relu_param(local_88);
      ReLUParameter::MergeFrom(this_23,from_23);
    }
    if ((uVar1 & 0x4000000) != 0) {
      this_24 = mutable_sigmoid_param(this);
      from_24 = sigmoid_param(local_88);
      SigmoidParameter::MergeFrom(this_24,from_24);
    }
    if ((uVar1 & 0x8000000) != 0) {
      this_25 = mutable_softmax_param(this);
      from_25 = softmax_param(local_88);
      SoftmaxParameter::MergeFrom(this_25,from_25);
    }
    if ((uVar1 & 0x10000000) != 0) {
      this_26 = mutable_slice_param(this);
      from_26 = slice_param(local_88);
      SliceParameter::MergeFrom(this_26,from_26);
    }
    if ((uVar1 & 0x20000000) != 0) {
      this_27 = mutable_tanh_param(this);
      from_27 = tanh_param(local_88);
      TanHParameter::MergeFrom(this_27,from_27);
    }
    if ((uVar1 & 0x40000000) != 0) {
      this_28 = mutable_threshold_param(this);
      from_28 = threshold_param(local_88);
      ThresholdParameter::MergeFrom(this_28,from_28);
    }
    if ((uVar1 & 0x80000000) != 0) {
      this_29 = mutable_window_data_param(this);
      from_29 = window_data_param(local_88);
      WindowDataParameter::MergeFrom(this_29,from_29);
    }
  }
  local_48 = &local_88->_has_bits_;
  local_4c = 1;
  uVar1 = (local_88->_has_bits_).has_bits_[1];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      this_30 = mutable_python_param(this);
      from_30 = python_param(local_88);
      PythonParameter::MergeFrom(this_30,from_30);
    }
    if ((uVar1 & 2) != 0) {
      this_31 = mutable_prelu_param(this);
      from_31 = prelu_param(local_88);
      PReLUParameter::MergeFrom(this_31,from_31);
    }
    if ((uVar1 & 4) != 0) {
      this_32 = mutable_spp_param(this);
      from_32 = spp_param(local_88);
      SPPParameter::MergeFrom(this_32,from_32);
    }
    if ((uVar1 & 8) != 0) {
      this_33 = mutable_reshape_param(this);
      from_33 = reshape_param(local_88);
      ReshapeParameter::MergeFrom(this_33,from_33);
    }
    if ((uVar1 & 0x10) != 0) {
      this_34 = mutable_log_param(this);
      from_34 = log_param(local_88);
      LogParameter::MergeFrom(this_34,from_34);
    }
    if ((uVar1 & 0x20) != 0) {
      this_35 = mutable_flatten_param(this);
      from_35 = flatten_param(local_88);
      FlattenParameter::MergeFrom(this_35,from_35);
    }
    if ((uVar1 & 0x40) != 0) {
      this_36 = mutable_reduction_param(this);
      from_36 = reduction_param(local_88);
      ReductionParameter::MergeFrom(this_36,from_36);
    }
    if ((uVar1 & 0x80) != 0) {
      this_37 = mutable_embed_param(this);
      from_37 = embed_param(local_88);
      EmbedParameter::MergeFrom(this_37,from_37);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this_38 = mutable_tile_param(this);
      from_38 = tile_param(local_88);
      TileParameter::MergeFrom(this_38,from_38);
    }
    if ((uVar1 & 0x200) != 0) {
      this_39 = mutable_batch_norm_param(this);
      from_39 = batch_norm_param(local_88);
      BatchNormParameter::MergeFrom(this_39,from_39);
    }
    if ((uVar1 & 0x400) != 0) {
      this_40 = mutable_elu_param(this);
      from_40 = elu_param(local_88);
      ELUParameter::MergeFrom(this_40,from_40);
    }
    if ((uVar1 & 0x800) != 0) {
      this_41 = mutable_bias_param(this);
      from_41 = bias_param(local_88);
      BiasParameter::MergeFrom(this_41,from_41);
    }
    if ((uVar1 & 0x1000) != 0) {
      this_42 = mutable_scale_param(this);
      from_42 = scale_param(local_88);
      ScaleParameter::MergeFrom(this_42,from_42);
    }
    if ((uVar1 & 0x2000) != 0) {
      this_43 = mutable_input_param(this);
      from_43 = input_param(local_88);
      InputParameter::MergeFrom(this_43,from_43);
    }
    if ((uVar1 & 0x4000) != 0) {
      this_44 = mutable_crop_param(this);
      from_44 = crop_param(local_88);
      CropParameter::MergeFrom(this_44,from_44);
    }
    if ((uVar1 & 0x8000) != 0) {
      this_45 = mutable_parameter_param(this);
      from_45 = parameter_param(local_88);
      ParameterParameter::MergeFrom(this_45,from_45);
    }
  }
  if ((uVar1 & 0x30000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      this_46 = mutable_recurrent_param(this);
      from_46 = recurrent_param(local_88);
      RecurrentParameter::MergeFrom(this_46,from_46);
    }
    if ((uVar1 & 0x20000) != 0) {
      this->phase_ = local_88->phase_;
    }
    (this->_has_bits_).has_bits_[1] = uVar1 | (this->_has_bits_).has_bits_[1];
  }
  return;
}

Assistant:

void LayerParameter::MergeFrom(const LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blobs_.MergeFrom(from.blobs_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  propagate_down_.MergeFrom(from.propagate_down_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_type();
      type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_python_param()->::caffe::PythonParameter::MergeFrom(from.python_param());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_prelu_param()->::caffe::PReLUParameter::MergeFrom(from.prelu_param());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_spp_param()->::caffe::SPPParameter::MergeFrom(from.spp_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_reshape_param()->::caffe::ReshapeParameter::MergeFrom(from.reshape_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_log_param()->::caffe::LogParameter::MergeFrom(from.log_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_flatten_param()->::caffe::FlattenParameter::MergeFrom(from.flatten_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_reduction_param()->::caffe::ReductionParameter::MergeFrom(from.reduction_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_embed_param()->::caffe::EmbedParameter::MergeFrom(from.embed_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_tile_param()->::caffe::TileParameter::MergeFrom(from.tile_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_batch_norm_param()->::caffe::BatchNormParameter::MergeFrom(from.batch_norm_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_elu_param()->::caffe::ELUParameter::MergeFrom(from.elu_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_bias_param()->::caffe::BiasParameter::MergeFrom(from.bias_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_scale_param()->::caffe::ScaleParameter::MergeFrom(from.scale_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_input_param()->::caffe::InputParameter::MergeFrom(from.input_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_crop_param()->::caffe::CropParameter::MergeFrom(from.crop_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_parameter_param()->::caffe::ParameterParameter::MergeFrom(from.parameter_param());
    }
  }
  if (cached_has_bits & 196608u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_recurrent_param()->::caffe::RecurrentParameter::MergeFrom(from.recurrent_param());
    }
    if (cached_has_bits & 0x00020000u) {
      phase_ = from.phase_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}